

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdObjFindOrAdd(If_DsdMan_t *p,int Type,int *pLits,int nLits,word *pTruth)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  int local_70;
  int local_6c;
  int Lit;
  int fCompl;
  Vec_Int_t *vLevel;
  Vec_Int_t *vSets;
  uint *pSpot;
  int truthId;
  int objId;
  int PrevSize;
  word *pTruth_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  if (Type == 6) {
    local_6c = Vec_MemEntryNum(p->vTtMem[nLits]);
    local_70 = Vec_MemHashInsert(p->vTtMem[nLits],pTruth);
  }
  else {
    local_6c = -1;
    local_70 = -1;
  }
  puVar4 = If_DsdObjHashLookup(p,Type,pLits,nLits,local_70);
  if (*puVar4 == 0) {
    if (((p->LutSize != 0) && (-1 < local_70)) &&
       (iVar1 = Vec_PtrSize(p->vTtDecs[nLits]), local_70 == iVar1)) {
      pVVar5 = Dau_DecFindSets_int(pTruth,nLits,p->pSched);
      iVar1 = Vec_MemEntryNum(p->vTtMem[nLits]);
      if (local_70 != iVar1 + -1) {
        __assert_fail("truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3ed,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
      }
      Vec_PtrPush(p->vTtDecs[nLits],pVVar5);
    }
    if (((p->vIsops[nLits] != (Vec_Wec_t *)0x0) && (-1 < local_70)) &&
       (iVar1 = Vec_MemEntryNum(p->vTtMem[nLits]), local_6c != iVar1)) {
      pVVar5 = Vec_WecPushLevel(p->vIsops[nLits]);
      iVar1 = Kit_TruthIsop((uint *)pTruth,nLits,p->vCover,1);
      if ((-1 < iVar1) && (iVar2 = Vec_IntSize(p->vCover), iVar2 < 9)) {
        iVar2 = Vec_IntSize(p->vCover);
        Vec_IntGrow(pVVar5,iVar2);
        Vec_IntAppend(pVVar5,p->vCover);
        if (iVar1 != 0) {
          pVVar5->nCap = pVVar5->nCap ^ 0x10000;
        }
      }
      iVar1 = Vec_WecSize(p->vIsops[nLits]);
      iVar2 = Vec_MemEntryNum(p->vTtMem[nLits]);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3fc,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
      }
    }
    if (((p->pTtGia != (Gia_Man_t *)0x0) && (-1 < local_70)) &&
       (iVar1 = Vec_MemEntryNum(p->vTtMem[nLits]), local_70 == iVar1 + -1)) {
      iVar1 = Kit_TruthToGia(p->pTtGia,(uint *)pTruth,nLits,p->vCover,(Vec_Int_t *)0x0,1);
      Gia_ManAppendCo(p->pTtGia,iVar1);
    }
    uVar3 = Vec_PtrSize(&p->vObjs);
    *puVar4 = uVar3;
    p_local._4_4_ = If_DsdObjCreate(p,Type,pLits,nLits,local_70);
    iVar1 = Vec_PtrSize(&p->vObjs);
    if (p->nBins < iVar1) {
      If_DsdObjHashResize(p);
    }
  }
  else {
    p_local._4_4_ = *puVar4;
  }
  return p_local._4_4_;
}

Assistant:

int If_DsdObjFindOrAdd( If_DsdMan_t * p, int Type, int * pLits, int nLits, word * pTruth )
{
    int PrevSize       = (Type == IF_DSD_PRIME) ? Vec_MemEntryNum( p->vTtMem[nLits] ) : -1;   
    int objId, truthId = (Type == IF_DSD_PRIME) ? Vec_MemHashInsert(p->vTtMem[nLits], pTruth) : -1;
    unsigned * pSpot = If_DsdObjHashLookup( p, Type, pLits, nLits, truthId );
//abctime clk;
    if ( *pSpot )
        return (int)*pSpot;
//clk = Abc_Clock();
    if ( p->LutSize && truthId >= 0 && truthId == Vec_PtrSize(p->vTtDecs[nLits]) )
    {
        Vec_Int_t * vSets = Dau_DecFindSets_int( pTruth, nLits, p->pSched );
        assert( truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 );
        Vec_PtrPush( p->vTtDecs[nLits], vSets );
//        Dau_DecPrintSets( vSets, nLits );
    }
    if ( p->vIsops[nLits] && truthId >= 0 && PrevSize != Vec_MemEntryNum(p->vTtMem[nLits]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vIsops[nLits] );
        int fCompl = Kit_TruthIsop( (unsigned *)pTruth, nLits, p->vCover, 1 );
        if ( fCompl >= 0 && Vec_IntSize(p->vCover) <= 8 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits]) );
    }
    if ( p->pTtGia && truthId >= 0 && truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 )
    {
//        int nObjOld = Gia_ManAndNum(p->pTtGia);
        int Lit = Kit_TruthToGia( p->pTtGia, (unsigned *)pTruth, nLits, p->vCover, NULL, 1 );
//        printf( "%d ", Gia_ManAndNum(p->pTtGia)-nObjOld );
        Gia_ManAppendCo( p->pTtGia, Lit );
    }
//p->timeCheck += Abc_Clock() - clk;
    *pSpot = Vec_PtrSize( &p->vObjs );
    objId = If_DsdObjCreate( p, Type, pLits, nLits, truthId );
    if ( Vec_PtrSize(&p->vObjs) > p->nBins )
        If_DsdObjHashResize( p );
    return objId;
}